

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O0

QString * __thiscall
QStringBuilder<ProString,_QLatin1String>::convertTo<QString>
          (QStringBuilder<ProString,_QLatin1String> *this)

{
  long lVar1;
  bool bVar2;
  qsizetype qVar3;
  DataPointer *this_00;
  QStringBuilder<ProString,_QLatin1String> *in_RDI;
  long in_FS_OFFSET;
  iterator start;
  qsizetype len;
  QString *s;
  iterator d;
  type *in_stack_ffffffffffffffa8;
  QStringBuilder<ProString,_QLatin1String> *p;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  p = in_RDI;
  bVar2 = isNull(in_RDI);
  if (bVar2) {
    QString::QString((QString *)0x2bc6cc);
  }
  else {
    qVar3 = QConcatenable<QStringBuilder<ProString,_QLatin1String>_>::size(p);
    (in_RDI->a).m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    (in_RDI->a).m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    (in_RDI->a).m_string.d.size = -0x5555555555555556;
    QString::QString((QString *)in_RDI,qVar3,Uninitialized);
    this_00 = QString::data_ptr((QString *)in_RDI);
    QArrayDataPointer<char16_t>::data(this_00);
    QConcatenable<QStringBuilder<ProString,_QLatin1String>_>::appendTo<QChar>
              (in_stack_ffffffffffffffa8,(QChar **)0x2bc746);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QString *)p;
}

Assistant:

T convertTo() const
    {
        if (isNull()) {
            // appending two null strings must give back a null string,
            // so we're special casing this one out, QTBUG-114206
            return T();
        }

        const qsizetype len = Concatenable::size(*this);
        T s(len, Qt::Uninitialized);

        // Using data_ptr() here (private API) so we can bypass the
        // isDetached() and the replacement of a null pointer with _empty in
        // both QString and QByteArray's data() and constData(). The result is
        // the same if len != 0.
        auto d = reinterpret_cast<typename T::iterator>(s.data_ptr().data());
        const auto start = d;
        Concatenable::appendTo(*this, d);

        if constexpr (Concatenable::ExactSize) {
            Q_UNUSED(start)
        } else {
            if (len != d - start) {
                // this resize is necessary since we allocate a bit too much
                // when dealing with variable sized 8-bit encodings
                s.resize(d - start);
            }
        }
        return s;
    }